

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EndCriteria.cpp
# Opt level: O2

ostream * QuantLib::operator<<(ostream *out,Type ec)

{
  ostream *poVar1;
  char *pcVar2;
  
  switch(ec) {
  case None:
    pcVar2 = "None";
    break;
  case MaxIterations:
    pcVar2 = "MaxIterations";
    break;
  case StationaryPoint:
    pcVar2 = "StationaryPoint";
    break;
  case StationaryFunctionValue:
    pcVar2 = "StationaryFunctionValue";
    break;
  case StationaryFunctionAccuracy:
    pcVar2 = "StationaryFunctionAccuracy";
    break;
  case ZeroGradientNorm:
    pcVar2 = "ZeroGradientNorm";
    break;
  case Unknown:
    pcVar2 = "Unknown";
    break;
  default:
    snprintf(painCave.errMsg,2000,"unknown EndCriteria::Type ( %d )\n");
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
    return out;
  }
  poVar1 = std::operator<<(out,pcVar2);
  return poVar1;
}

Assistant:

std::ostream& operator<<(std::ostream& out, EndCriteria::Type ec) {
    switch (ec) {
    case QuantLib::EndCriteria::None:
      return out << "None";
    case QuantLib::EndCriteria::MaxIterations:
      return out << "MaxIterations";
    case QuantLib::EndCriteria::StationaryPoint:
      return out << "StationaryPoint";
    case QuantLib::EndCriteria::StationaryFunctionValue:
      return out << "StationaryFunctionValue";
    case QuantLib::EndCriteria::StationaryFunctionAccuracy:
      return out << "StationaryFunctionAccuracy";
    case QuantLib::EndCriteria::ZeroGradientNorm:
      return out << "ZeroGradientNorm";
    case QuantLib::EndCriteria::Unknown:
      return out << "Unknown";
    default:
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "unknown EndCriteria::Type ( %d )\n", int(ec));
      painCave.isFatal  = 1;
      painCave.severity = OPENMD_ERROR;
      simError();
    }
    return out;
  }